

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O3

void __thiscall
basisu::basisu_frontend::create_optimized_selector_codebook(basisu_frontend *this,uint32_t iter)

{
  etc_block *peVar1;
  int iVar2;
  uint32_t x;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  char *__function;
  uint uVar6;
  uint32_t new_size;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint32_t y;
  uint uVar13;
  uint32_t y_1;
  uint uVar14;
  bool bVar15;
  image selector_cluster_vis;
  interval_timer tm;
  char buf [256];
  image local_188;
  ulong local_168;
  vector<unsigned_int> *local_160;
  vector<basisu::etc_block> *local_158;
  interval_timer local_150;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  
  debug_printf("create_optimized_selector_codebook\n");
  interval_timer::interval_timer(&local_150);
  interval_timer::start(&local_150);
  uVar13 = (this->m_selector_cluster_block_indices).m_size;
  debug_printf("Total selector clusters (from m_selector_cluster_block_indices.size()): %u\n");
  local_158 = &this->m_optimized_cluster_selectors;
  uVar6 = (this->m_optimized_cluster_selectors).m_size;
  if (uVar6 != uVar13) {
    if ((uVar6 <= uVar13) && ((this->m_optimized_cluster_selectors).m_capacity < uVar13)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)local_158,uVar13,uVar6 + 1 == uVar13,8,(object_mover)0x0,false)
      ;
    }
    (this->m_optimized_cluster_selectors).m_size = uVar13;
  }
  if (uVar13 != 0) {
    uVar6 = 0;
    do {
      uVar14 = uVar6 + 0x100;
      local_138._12_4_ = uVar14;
      if (uVar13 < uVar14) {
        local_138._12_4_ = uVar13;
      }
      local_120 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:2339:34)>
                  ::_M_invoke;
      local_128 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:2339:34)>
                  ::_M_manager;
      local_138._M_unused._M_object = this;
      local_138._8_4_ = uVar6;
      job_pool::add_job((this->m_params).m_pJob_pool,(function<void_()> *)&local_138);
      if (local_128 != (code *)0x0) {
        (*local_128)(&local_138,&local_138,__destroy_functor);
      }
      uVar6 = uVar14;
    } while (uVar14 < uVar13);
  }
  job_pool::wait_for_all((this->m_params).m_pJob_pool);
  interval_timer::get_elapsed_secs(&local_150);
  debug_printf("Elapsed time: %3.3f secs\n");
  if ((this->m_params).m_debug_images == true) {
    uVar13 = (this->m_selector_cluster_block_indices).m_size;
    if ((ulong)uVar13 == 0) {
      uVar6 = 0;
    }
    else {
      lVar8 = 0;
      uVar6 = 0;
      do {
        uVar14 = *(uint *)((long)&((this->m_selector_cluster_block_indices).m_p)->m_size + lVar8);
        if (uVar14 < uVar6) {
          uVar14 = uVar6;
        }
        uVar6 = uVar14;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)uVar13 << 4 != lVar8);
      uVar6 = uVar6 * 5;
      if (0x7fff < uVar6) {
        return;
      }
    }
    image::image(&local_188,uVar6 + 0x10,uVar13 * 5,0xffffffff);
    if ((this->m_selector_cluster_block_indices).m_size != 0) {
      uVar9 = 0;
      uVar7 = 0;
      do {
        local_168 = uVar7;
        local_160 = (this->m_selector_cluster_block_indices).m_p + uVar9;
        iVar2 = (int)uVar9 * 5;
        uVar13 = 0;
        uVar7 = local_168;
        do {
          uVar14 = 0;
          uVar6 = 4;
          do {
            if ((this->m_optimized_cluster_selectors).m_size <= uVar9) goto LAB_0022e92a;
            if (3 < (uVar6 - 4 | uVar13)) {
LAB_0022e8ec:
              __assert_fail("(x | y) < 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                            ,0xe3,
                            "uint32_t basisu::etc_block::get_raw_selector(uint32_t, uint32_t) const"
                           );
            }
            lVar8 = uVar9 * 8 - (ulong)(uVar6 - 4 >> 1);
            uVar4 = (uint)*(byte *)((long)&g_etc1_to_selector_index +
                                   (ulong)((uint)((*(byte *)((long)local_158->m_p + lVar8 + 7) >>
                                                   (uVar14 & 4 | uVar13 & 0x1f) & 1) != 0) +
                                          (*(byte *)((long)local_158->m_p + lVar8 + 5) >>
                                           ((byte)(uVar14 & 4) | (byte)uVar13 & 0x1f) & 1) * 2)) *
                    0x55;
            if (0xfe < uVar4) {
              uVar4 = 0xff;
            }
            if ((uVar6 < local_188.m_width) && (uVar13 + iVar2 < local_188.m_height)) {
              uVar10 = local_188.m_pitch * (int)uVar7 + uVar6;
              if (local_188.m_pixels.m_size <= uVar10) goto LAB_0022e90b;
              local_188.m_pixels.m_p[uVar10].field_0 =
                   (anon_union_4_2_6eba8969_for_color_rgba_0)(uVar4 * 0x10101 | 0xff000000);
            }
            uVar14 = uVar14 + 4;
            bVar15 = uVar6 != 7;
            uVar6 = uVar6 + 1;
          } while (bVar15);
          uVar13 = uVar13 + 1;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar13 != 4);
        if (local_160->m_size != 0) {
          uVar13 = 0;
          iVar12 = 0x10;
          do {
            uVar6 = local_160->m_p[uVar13];
            if ((this->m_orig_encoded_blocks).m_size <= uVar6) goto LAB_0022e92a;
            peVar1 = (this->m_orig_encoded_blocks).m_p;
            uVar14 = 0;
            uVar7 = local_168;
            do {
              uVar4 = 0;
              uVar3 = 0;
              do {
                uVar10 = (uint)uVar3;
                if (3 < (uVar10 | uVar14)) goto LAB_0022e8ec;
                lVar8 = (ulong)uVar6 * 8 - (uVar3 >> 1);
                uVar5 = (uint)*(byte *)((long)&g_etc1_to_selector_index +
                                       (ulong)((uint)((*(byte *)((long)peVar1 + lVar8 + 7) >>
                                                       (uVar4 & 4 | uVar14 & 0x1f) & 1) != 0) +
                                              (*(byte *)((long)peVar1 + lVar8 + 5) >>
                                               ((byte)(uVar4 & 4) | (byte)uVar14 & 0x1f) & 1) * 2))
                        * 0x55;
                if (0xfe < uVar5) {
                  uVar5 = 0xff;
                }
                if ((iVar12 + uVar10 < local_188.m_width) && (uVar14 + iVar2 < local_188.m_height))
                {
                  uVar11 = iVar12 + uVar10 + local_188.m_pitch * (int)uVar7;
                  if (local_188.m_pixels.m_size <= uVar11) goto LAB_0022e90b;
                  local_188.m_pixels.m_p[uVar11].field_0 =
                       (anon_union_4_2_6eba8969_for_color_rgba_0)(uVar5 * 0x10101 | 0xff000000);
                }
                uVar3 = (ulong)(uVar10 + 1);
                uVar4 = uVar4 + 4;
              } while (uVar10 + 1 != 4);
              uVar14 = uVar14 + 1;
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (uVar14 != 4);
            uVar13 = uVar13 + 1;
            iVar12 = iVar12 + 5;
          } while (uVar13 < local_160->m_size);
        }
        uVar9 = uVar9 + 1;
        uVar7 = (ulong)((int)local_168 + 5);
      } while (uVar9 < (this->m_selector_cluster_block_indices).m_size);
    }
    snprintf(local_138._M_pod_data,0x100,"selector_cluster_vis_%u.png");
    save_png(local_138._M_pod_data,&local_188,0,0);
    if (local_188.m_pixels.m_p != (color_rgba *)0x0) {
      free(local_188.m_pixels.m_p);
    }
  }
  return;
LAB_0022e92a:
  __function = "T &basisu::vector<basisu::etc_block>::operator[](size_t) [T = basisu::etc_block]";
  goto LAB_0022e920;
LAB_0022e90b:
  __function = "T &basisu::vector<basisu::color_rgba>::operator[](size_t) [T = basisu::color_rgba]";
LAB_0022e920:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,__function);
}

Assistant:

void basisu_frontend::create_optimized_selector_codebook(uint32_t iter)
	{
		debug_printf("create_optimized_selector_codebook\n");

		interval_timer tm;
		tm.start();

		const uint32_t total_selector_clusters = (uint32_t)m_selector_cluster_block_indices.size();

		debug_printf("Total selector clusters (from m_selector_cluster_block_indices.size()): %u\n", (uint32_t)m_selector_cluster_block_indices.size());

		m_optimized_cluster_selectors.resize(total_selector_clusters);
		
		// For each selector codebook entry, and for each of the 4x4 selectors, determine which selector minimizes the error across all the blocks that use that quantized selector.
		const uint32_t N = 256;
		for (uint32_t cluster_index_iter = 0; cluster_index_iter < total_selector_clusters; cluster_index_iter += N)
		{
			const uint32_t first_index = cluster_index_iter;
			const uint32_t last_index = minimum<uint32_t>((uint32_t)total_selector_clusters, cluster_index_iter + N);

#ifndef __EMSCRIPTEN__			
			m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

				for (uint32_t cluster_index = first_index; cluster_index < last_index; cluster_index++)
				{
					const basisu::vector<uint32_t>& cluster_block_indices = m_selector_cluster_block_indices[cluster_index];

					if (!cluster_block_indices.size())
						continue;

					uint64_t total_err[4][4][4];
					clear_obj(total_err);

					for (uint32_t cluster_block_index = 0; cluster_block_index < cluster_block_indices.size(); cluster_block_index++)
					{
						const uint32_t block_index = cluster_block_indices[cluster_block_index];

						const etc_block& blk = m_encoded_blocks[block_index];

						color_rgba blk_colors[4];
						blk.get_block_colors(blk_colors, 0);

						for (uint32_t y = 0; y < 4; y++)
						{
							for (uint32_t x = 0; x < 4; x++)
							{
								const color_rgba& orig_color = get_source_pixel_block(block_index)(x, y);

								if (m_params.m_perceptual)
								{
									for (uint32_t s = 0; s < 4; s++)
										total_err[y][x][s] += color_distance(true, blk_colors[s], orig_color, false);
								}
								else
								{
									for (uint32_t s = 0; s < 4; s++)
										total_err[y][x][s] += color_distance(false, blk_colors[s], orig_color, false);
								}
							} // x
						} // y

					} // cluster_block_index

					for (uint32_t y = 0; y < 4; y++)
					{
						for (uint32_t x = 0; x < 4; x++)
						{
							uint64_t best_err = total_err[y][x][0];
							uint8_t best_sel = 0;

							for (uint32_t s = 1; s < 4; s++)
							{
								if (total_err[y][x][s] < best_err)
								{
									best_err = total_err[y][x][s];
									best_sel = (uint8_t)s;
								}
							}

							m_optimized_cluster_selectors[cluster_index].set_selector(x, y, best_sel);
						} // x
					} // y

				} // cluster_index

#ifndef __EMSCRIPTEN__
				});
#endif

		} // cluster_index_iter

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif

		debug_printf("Elapsed time: %3.3f secs\n", tm.get_elapsed_secs());
				
		if (m_params.m_debug_images)
		{
			uint32_t max_selector_cluster_size = 0;

			for (uint32_t i = 0; i < m_selector_cluster_block_indices.size(); i++)
				max_selector_cluster_size = maximum<uint32_t>(max_selector_cluster_size, (uint32_t)m_selector_cluster_block_indices[i].size());

			if ((max_selector_cluster_size * 5) < 32768)
			{
				const uint32_t x_spacer_len = 16;
				image selector_cluster_vis(x_spacer_len + max_selector_cluster_size * 5, (uint32_t)m_selector_cluster_block_indices.size() * 5);

				for (uint32_t selector_cluster_index = 0; selector_cluster_index < m_selector_cluster_block_indices.size(); selector_cluster_index++)
				{
					const basisu::vector<uint32_t> &cluster_block_indices = m_selector_cluster_block_indices[selector_cluster_index];

					for (uint32_t y = 0; y < 4; y++)
						for (uint32_t x = 0; x < 4; x++)
							selector_cluster_vis.set_clipped(x_spacer_len + x - 12, selector_cluster_index * 5 + y, color_rgba((m_optimized_cluster_selectors[selector_cluster_index].get_selector(x, y) * 255) / 3));

					for (uint32_t i = 0; i < cluster_block_indices.size(); i++)
					{
						uint32_t block_index = cluster_block_indices[i];

						const etc_block &blk = m_orig_encoded_blocks[block_index];
						
						for (uint32_t y = 0; y < 4; y++)
							for (uint32_t x = 0; x < 4; x++)
								selector_cluster_vis.set_clipped(x_spacer_len + x + 5 * i, selector_cluster_index * 5 + y, color_rgba((blk.get_selector(x, y) * 255) / 3));
					}
				}

				char buf[256];
				snprintf(buf, sizeof(buf), "selector_cluster_vis_%u.png", iter);
				save_png(buf, selector_cluster_vis);
			}
		}
	}